

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O3

lys_node * resolve_json_nodeid(char *nodeid,ly_ctx *ctx,lys_node *start,int output)

{
  LYS_NODE LVar1;
  uint uVar2;
  int iVar3;
  lys_node_list *node;
  lys_node_list *plVar4;
  lys_module *plVar5;
  lys_module *plVar6;
  char *pcVar7;
  lys_module *module;
  char *yang_data_name;
  LY_ECODE ecode;
  ly_ctx *ctx_00;
  ulong uVar8;
  char *pcVar9;
  lys_node_list *list;
  size_t __n;
  int local_80;
  char *local_78;
  char *name;
  char *local_68;
  char *local_60;
  int local_54;
  char *pcStack_50;
  int has_predicate;
  char *mod_name;
  uint local_40;
  int local_3c;
  int local_38;
  int nam_len;
  int is_relative;
  int mod_name_len;
  
  local_38 = -1;
  if ((nodeid == (char *)0x0) || (ctx == (ly_ctx *)0x0 && start == (lys_node *)0x0)) {
    __assert_fail("nodeid && (ctx || start)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                  ,0x931,
                  "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                 );
  }
  if (ctx == (ly_ctx *)0x0) {
    ctx = start->module->ctx;
  }
  uVar2 = parse_schema_nodeid(nodeid,&stack0xffffffffffffffb0,&nam_len,&local_78,&local_3c,&local_38
                              ,(int *)0x0,(int *)0x0,1);
  if ((int)uVar2 < 1) {
    pcVar7 = nodeid + -uVar2;
    uVar8 = (ulong)(uint)(int)nodeid[-uVar2];
LAB_0011417c:
    ly_vlog(ctx,LYE_PATH_INCHAR,LY_VLOG_NONE,(void *)0x0,uVar8,pcVar7);
    return (lys_node *)0x0;
  }
  if (*local_78 == '#') {
    if (local_38 != 0) {
      uVar8 = 0x23;
      pcVar7 = local_78;
      goto LAB_0011417c;
    }
    yang_data_name = local_78 + 1;
    local_80 = local_3c + -1;
    name = (char *)CONCAT44(name._4_4_,nam_len);
    pcVar9 = nodeid + uVar2;
    pcVar7 = pcStack_50;
  }
  else {
    local_38 = -1;
    pcVar7 = (char *)0x0;
    yang_data_name = (char *)0x0;
    pcVar9 = nodeid;
  }
  local_68 = nodeid;
  mod_name = (char *)ctx;
  local_40 = parse_schema_nodeid(pcVar9,&stack0xffffffffffffffb0,&nam_len,&local_78,&local_3c,
                                 &local_38,&local_54,(int *)0x0,0);
  ctx_00 = (ly_ctx *)mod_name;
  uVar8 = (ulong)local_40;
  if ((int)local_40 < 1) {
    pcVar7 = pcVar9 + -local_40;
    uVar8 = (ulong)(uint)(int)pcVar9[-local_40];
    ctx = (ly_ctx *)mod_name;
    goto LAB_0011417c;
  }
  if (pcVar7 != (char *)0x0) {
    nam_len = (int)name;
    pcStack_50 = pcVar7;
  }
  local_60 = pcVar9;
  if (local_38 == 0) {
    if (pcStack_50 == (char *)0x0) {
      ly_vlog((ly_ctx *)mod_name,LYE_PATH_MISSMOD,LY_VLOG_STR,local_68);
      return (lys_node *)0x0;
    }
    pcVar7 = strndup(pcStack_50,(long)nam_len);
    module = ly_ctx_get_module(ctx_00,pcVar7,(char *)0x0,1);
    free(pcVar7);
    if (module == (lys_module *)0x0) {
      pcVar7 = strndup(local_68,(size_t)(pcStack_50 + ((long)nam_len - (long)local_68)));
LAB_00114241:
      ecode = LYE_PATH_INMOD;
      goto LAB_00114146;
    }
    if (yang_data_name == (char *)0x0) {
      node = (lys_node_list *)0x0;
LAB_0011424e:
      pcStack_50 = (char *)0x0;
      nam_len = 0;
      goto LAB_00113f20;
    }
    node = (lys_node_list *)lyp_get_yang_data_template(module,yang_data_name,local_80);
    if (node != (lys_node_list *)0x0) goto LAB_0011424e;
    local_78 = yang_data_name + ((long)local_80 - (long)local_68);
  }
  else {
    node = (lys_node_list *)start;
    if (start == (lys_node *)0x0) {
      __assert_fail("start",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/resolve.c"
                    ,0x957,
                    "const struct lys_node *resolve_json_nodeid(const char *, const struct ly_ctx *, const struct lys_node *, int)"
                   );
    }
    do {
      if (node->nodetype != LYS_USES) goto LAB_00113f1c;
      node = (lys_node_list *)lys_parent((lys_node *)node);
    } while (node != (lys_node_list *)0x0);
    node = (lys_node_list *)0x0;
LAB_00113f1c:
    module = start->module;
LAB_00113f20:
    plVar4 = (lys_node_list *)lys_getnext((lys_node *)0x0,(lys_node *)node,module,0);
    if (plVar4 != (lys_node_list *)0x0) {
      local_60 = local_60 + uVar8;
      name = (char *)module;
LAB_00113f46:
      do {
        list = plVar4;
        pcVar7 = list->name;
        if (pcVar7 != (char *)0x0) {
          __n = (size_t)local_3c;
          iVar3 = strncmp(local_78,pcVar7,__n);
          if ((iVar3 == 0) && (plVar4 = list, pcVar7[__n] == '\0')) {
            do {
              plVar4 = (lys_node_list *)lys_parent((lys_node *)plVar4);
              if (plVar4 == (lys_node_list *)0x0) goto LAB_00113fa6;
              LVar1 = plVar4->nodetype;
            } while ((LVar1 & (LYS_OUTPUT|LYS_INPUT)) == LYS_UNKNOWN);
            if (output == 0) {
              if (LVar1 != LYS_OUTPUT) goto LAB_00113fa6;
            }
            else if (LVar1 != LYS_INPUT) {
LAB_00113fa6:
              plVar5 = (lys_module *)name;
              if ((pcStack_50 != (char *)0x0) &&
                 (plVar5 = ly_ctx_nget_module((ly_ctx *)mod_name,pcStack_50,(long)nam_len,
                                              (char *)0x0,1), plVar5 == (lys_module *)0x0)) {
                pcVar7 = strndup(local_68,(size_t)(pcStack_50 + ((long)nam_len - (long)local_68)));
                ctx_00 = (ly_ctx *)mod_name;
                goto LAB_00114241;
              }
              plVar6 = lys_node_module((lys_node *)list);
              ctx = (ly_ctx *)mod_name;
              if (plVar5 == plVar6) {
                pcVar9 = local_60;
                if (local_54 != 0) {
                  local_40 = 0;
                  if ((list->nodetype & (LYS_LEAFLIST|LYS_LEAF)) == LYS_UNKNOWN) {
                    if (list->nodetype != LYS_LIST) {
                      uVar8 = (ulong)(uint)(int)*local_60;
                      pcVar7 = local_60;
                      goto LAB_0011417c;
                    }
                    iVar3 = resolve_json_schema_list_predicate(local_60,list,(int *)&local_40);
                    if (iVar3 != 0) {
                      return (lys_node *)0x0;
                    }
                  }
                  else {
                    local_40 = parse_schema_json_predicate
                                         (local_60,(char **)0x0,(int *)0x0,(char **)0x0,(int *)0x0,
                                          (char **)0x0,(int *)0x0,&local_54);
                    if ((int)local_40 < 1) {
                      pcVar7 = local_60 + -local_40;
                      uVar8 = (ulong)(uint)(int)local_60[-local_40];
                      goto LAB_0011417c;
                    }
                  }
                  pcVar9 = local_60 + (int)local_40;
                }
                uVar8 = (ulong)(uint)(int)*pcVar9;
                if ((int)*pcVar9 == 0) {
                  return (lys_node *)list;
                }
                pcVar7 = pcVar9;
                if ((list->nodetype & (LYS_ANYDATA|LYS_LEAFLIST|LYS_LEAF)) != LYS_UNKNOWN)
                goto LAB_0011417c;
                name = (char *)module;
                if (list->child != (lys_node *)0x0) {
                  name = (char *)lys_node_module(list->child);
                }
                local_40 = parse_schema_nodeid(pcVar9,&stack0xffffffffffffffb0,&nam_len,&local_78,
                                               &local_3c,&local_38,&local_54,(int *)0x0,0);
                if ((int)local_40 < 1) {
                  pcVar7 = pcVar9 + -local_40;
                  uVar8 = (ulong)(uint)(int)pcVar9[-local_40];
                  goto LAB_0011417c;
                }
                local_60 = pcVar9 + local_40;
                mod_name = (char *)ctx;
                plVar4 = (lys_node_list *)lys_getnext((lys_node *)0x0,(lys_node *)list,module,0);
                node = list;
                if (plVar4 == (lys_node_list *)0x0) break;
                goto LAB_00113f46;
              }
            }
          }
        }
        plVar4 = (lys_node_list *)lys_getnext((lys_node *)list,(lys_node *)node,module,0);
      } while (plVar4 != (lys_node_list *)0x0);
    }
    local_78 = local_78 + ((long)local_3c - (long)local_68);
  }
  pcVar7 = strndup(local_68,(size_t)local_78);
  ecode = LYE_PATH_INNODE;
  ctx_00 = (ly_ctx *)mod_name;
LAB_00114146:
  ly_vlog(ctx_00,ecode,LY_VLOG_STR,pcVar7);
  free(pcVar7);
  return (lys_node *)0x0;
}

Assistant:

const struct lys_node *
resolve_json_nodeid(const char *nodeid, const struct ly_ctx *ctx, const struct lys_node *start, int output)
{
    char *str;
    const char *name, *mod_name, *id, *backup_mod_name = NULL, *yang_data_name = NULL;
    const struct lys_node *sibling, *start_parent, *parent;
    int r, nam_len, mod_name_len, is_relative = -1, has_predicate;
    int yang_data_name_len, backup_mod_name_len;
    /* resolved import module from the start module, it must match the next node-name-match sibling */
    const struct lys_module *prefix_mod, *module, *prev_mod;

    assert(nodeid && (ctx || start));
    if (!ctx) {
        ctx = start->module->ctx;
    }

    id = nodeid;

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, NULL, NULL, 1)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }

    if (name[0] == '#') {
        if (is_relative) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, '#', name);
            return NULL;
        }
        yang_data_name = name + 1;
        yang_data_name_len = nam_len - 1;
        backup_mod_name = mod_name;
        backup_mod_name_len = mod_name_len;
        id += r;
    } else {
        is_relative = -1;
    }

    if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
        return NULL;
    }
    id += r;

    if (backup_mod_name) {
        mod_name = backup_mod_name;
        mod_name_len = backup_mod_name_len;
    }

    if (is_relative) {
        assert(start);
        start_parent = start;
        while (start_parent && (start_parent->nodetype == LYS_USES)) {
            start_parent = lys_parent(start_parent);
        }
        module = start->module;
    } else {
        if (!mod_name) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_MISSMOD, LY_VLOG_STR, nodeid);
            free(str);
            return NULL;
        }

        str = strndup(mod_name, mod_name_len);
        module = ly_ctx_get_module(ctx, str, NULL, 1);
        free(str);

        if (!module) {
            str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }
        start_parent = NULL;
        if (yang_data_name) {
            start_parent = lyp_get_yang_data_template(module, yang_data_name, yang_data_name_len);
            if (!start_parent) {
                str = strndup(nodeid, (yang_data_name + yang_data_name_len) - nodeid);
                LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
                free(str);
                return NULL;
            }
        }

        /* now it's as if there was no module name */
        mod_name = NULL;
        mod_name_len = 0;
    }

    prev_mod = module;

    while (1) {
        sibling = NULL;
        while ((sibling = lys_getnext(sibling, start_parent, module, 0))) {
            /* name match */
            if (sibling->name && !strncmp(name, sibling->name, nam_len) && !sibling->name[nam_len]) {
                /* output check */
                for (parent = lys_parent(sibling); parent && !(parent->nodetype & (LYS_INPUT | LYS_OUTPUT)); parent = lys_parent(parent));
                if (parent) {
                    if (output && (parent->nodetype == LYS_INPUT)) {
                        continue;
                    } else if (!output && (parent->nodetype == LYS_OUTPUT)) {
                        continue;
                    }
                }

                /* module check */
                if (mod_name) {
                    /* will also find an augment module */
                    prefix_mod = ly_ctx_nget_module(ctx, mod_name, mod_name_len, NULL, 1);

                    if (!prefix_mod) {
                        str = strndup(nodeid, (mod_name + mod_name_len) - nodeid);
                        LOGVAL(ctx, LYE_PATH_INMOD, LY_VLOG_STR, str);
                        free(str);
                        return NULL;
                    }
                } else {
                    prefix_mod = prev_mod;
                }
                if (prefix_mod != lys_node_module(sibling)) {
                    continue;
                }

                /* do we have some predicates on it? */
                if (has_predicate) {
                    r = 0;
                    if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST)) {
                        if ((r = parse_schema_json_predicate(id, NULL, NULL, NULL, NULL, NULL, NULL, &has_predicate)) < 1) {
                            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
                            return NULL;
                        }
                    } else if (sibling->nodetype == LYS_LIST) {
                        if (resolve_json_schema_list_predicate(id, (const struct lys_node_list *)sibling, &r)) {
                            return NULL;
                        }
                    } else {
                        LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                        return NULL;
                    }
                    id += r;
                }

                /* the result node? */
                if (!id[0]) {
                    return sibling;
                }

                /* move down the tree, if possible */
                if (sibling->nodetype & (LYS_LEAF | LYS_LEAFLIST | LYS_ANYDATA)) {
                    LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[0], id);
                    return NULL;
                }
                start_parent = sibling;

                /* update prev mod */
                prev_mod = (start_parent->child ? lys_node_module(start_parent->child) : module);
                break;
            }
        }

        /* no match */
        if (!sibling) {
            str = strndup(nodeid, (name + nam_len) - nodeid);
            LOGVAL(ctx, LYE_PATH_INNODE, LY_VLOG_STR, str);
            free(str);
            return NULL;
        }

        if ((r = parse_schema_nodeid(id, &mod_name, &mod_name_len, &name, &nam_len, &is_relative, &has_predicate, NULL, 0)) < 1) {
            LOGVAL(ctx, LYE_PATH_INCHAR, LY_VLOG_NONE, NULL, id[-r], &id[-r]);
            return NULL;
        }
        id += r;
    }

    /* cannot get here */
    LOGINT(ctx);
    return NULL;
}